

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O1

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                *objToStore,XSerializeEngine *serEng)

{
  bool bVar1;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *objToStore_00;
  XMLSize_t t;
  int key2;
  void *key1;
  RefHash2KeysTableOfEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
  e;
  int local_6c;
  XMLCh *local_68;
  RefHash2KeysTableOfEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
  local_60;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    XSerializeEngine::writeSize(serEng,objToStore->fHashModulus);
    local_60.fMemoryManager = objToStore->fMemoryManager;
    local_60.super_XMLEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>_>.
    _vptr_XMLEnumerator = (_func_int **)&PTR__RefHash2KeysTableOfEnumerator_004168d0;
    local_60.fAdopted = false;
    t = 0;
    local_60.fCurElem =
         (RefHash2KeysTableBucketElem<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>_>
          *)0x0;
    local_60.fCurHash = 0xffffffffffffffff;
    local_60.fLockPrimaryKey = (void *)0x0;
    local_60.fToEnum = objToStore;
    RefHash2KeysTableOfEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
    ::findNext(&local_60);
    while ((local_60.fCurElem !=
            (RefHash2KeysTableBucketElem<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>_>
             *)0x0 || (local_60.fCurHash != (local_60.fToEnum)->fHashModulus))) {
      RefHash2KeysTableOfEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
      ::nextElement(&local_60);
      t = t + 1;
    }
    XSerializeEngine::writeSize(serEng,t);
    RefHash2KeysTableOfEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
    ::Reset(&local_60);
    while ((local_60.fCurElem !=
            (RefHash2KeysTableBucketElem<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>_>
             *)0x0 || (local_60.fCurHash != (local_60.fToEnum)->fHashModulus))) {
      RefHash2KeysTableOfEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
      ::nextElementKey(&local_60,&local_68,&local_6c);
      XSerializeEngine::writeString(serEng,local_68,0,false);
      XSerializeEngine::operator<<(serEng,local_6c);
      objToStore_00 =
           RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
           ::get(objToStore,local_68,local_6c);
      storeObject(objToStore_00,serEng);
    }
    RefHash2KeysTableOfEnumerator<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
    ::~RefHash2KeysTableOfEnumerator(&local_60);
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefHash2KeysTableOf<ElemVector>* const objToStore
                                    , XSerializeEngine&                      serEng)
{
    if (serEng.needToStoreObject(objToStore))
    {
        serEng.writeSize (objToStore->getHashModulus());

        XMLSize_t itemNumber = 0;

        RefHash2KeysTableOfEnumerator<ElemVector> e(objToStore, false, objToStore->getMemoryManager());

        while (e.hasMoreElements())
        {
            e.nextElement();
            itemNumber++;
        }

        serEng.writeSize (itemNumber);
        e.Reset();

#ifdef XERCES_DEBUG_SORT_GRAMMAR

        //to sort the key
        SORT_KEYSET_TWOKEYS(serEng.getMemoryManager())

        //to store the data
        for (XMLSize_t i=0; i < itemNumber; i++)
        {
            GET_NEXT_KEYSET()

            serEng.writeString(strKey);
            serEng<<intKey1;

            ElemVector* data = objToStore->get(strKey, intKey1);
            storeObject(data, serEng);
        }
#else

        while (e.hasMoreElements())
        {
            void*      key1;
            int        key2;

            e.nextElementKey(key1, key2);
            serEng.writeString((const XMLCh*)key1);
            serEng<<key2;

            ElemVector* data = objToStore->get(key1, key2);
            storeObject(data, serEng);

        }
#endif
    }

}